

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O2

Abc_Obj_t * Mpm_ManGetAbcNode(Abc_Ntk_t *pNtk,Vec_Int_t *vCopy,int iMigLit)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  
  iVar1 = Vec_IntEntry(vCopy,iMigLit);
  if (-1 < iVar1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar1);
    return pAVar2;
  }
  if (-1 < iMigLit) {
    iVar1 = Vec_IntEntry(vCopy,iMigLit ^ 1);
    if (-1 < iVar1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar1);
      pAVar2 = Abc_NtkCreateNodeInv(pNtk,pAVar2);
      Vec_IntWriteEntry(vCopy,iMigLit,pAVar2->Id);
      return pAVar2;
    }
    __assert_fail("iObjId >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                  ,0x9e,"Abc_Obj_t *Mpm_ManGetAbcNode(Abc_Ntk_t *, Vec_Int_t *, int)");
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

Abc_Obj_t * Mpm_ManGetAbcNode( Abc_Ntk_t * pNtk, Vec_Int_t * vCopy, int iMigLit )
{
    Abc_Obj_t * pObj;
    int iObjId = Vec_IntEntry( vCopy, iMigLit );
    if ( iObjId >= 0 )
        return Abc_NtkObj( pNtk, iObjId );
    iObjId = Vec_IntEntry( vCopy, Abc_LitNot(iMigLit) );
    assert( iObjId >= 0 );
    pObj = Abc_NtkCreateNodeInv( pNtk, Abc_NtkObj(pNtk, iObjId) );
    Vec_IntWriteEntry( vCopy, iMigLit, Abc_ObjId(pObj) );
    return pObj;
}